

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

Reg ra_scratch(ASMState *as,RegSet allow)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = as->freeset & allow;
  if (uVar1 == 0) {
    uVar1 = ra_evict(as,allow);
  }
  else {
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x18;
  }
  as->modset = as->modset | 1 << ((byte)uVar1 & 0x1f);
  return uVar1;
}

Assistant:

static Reg ra_scratch(ASMState *as, RegSet allow)
{
  Reg r = ra_pick(as, allow);
  ra_modified(as, r);
  RA_DBGX((as, "scratch        $r", r));
  return r;
}